

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_on_pubsub_message(fio_msg_s *msg)

{
  fio_protocol_s *pr;
  int *piVar1;
  
  pr = fio_protocol_try_lock((intptr_t)msg->udata1,FIO_PR_LOCK_TASK);
  if (pr != (fio_protocol_s *)0x0) {
    if (*msg->udata2 != (code *)0x0) {
      (**msg->udata2)(pr);
    }
    fio_protocol_unlock(pr,FIO_PR_LOCK_TASK);
    return;
  }
  piVar1 = __errno_location();
  if (*piVar1 == 9) {
    return;
  }
  fio_message_defer(msg);
  return;
}

Assistant:

static void websocket_on_pubsub_message(fio_msg_s *msg) {
  fio_protocol_s *pr =
      fio_protocol_try_lock((intptr_t)msg->udata1, FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF)
      return;
    fio_message_defer(msg);
    return;
  }
  websocket_sub_data_s *d = msg->udata2;

  if (d->on_message)
    d->on_message((ws_s *)pr, msg->channel, msg->msg, d->udata);
  fio_protocol_unlock(pr, FIO_PR_LOCK_TASK);
}